

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UnicodeString *
icu_63::TimeZone::getCanonicalID
          (UnicodeString *id,UnicodeString *canonicalID,UBool *isSystemID,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  int8_t iVar3;
  ushort uVar4;
  int32_t length;
  
  uVar1 = (canonicalID->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = 2;
  if ((uVar1 & 1) == 0) {
    uVar4 = uVar1 & 0x1e;
  }
  (canonicalID->fUnion).fStackFields.fLengthAndFlags = uVar4;
  *isSystemID = '\0';
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar2 = (id->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      length = (id->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar2 >> 5;
    }
    iVar3 = UnicodeString::doCompare(id,0,length,L"Etc/Unknown",0,0xb);
    if (iVar3 == '\0') {
      UnicodeString::fastCopyFrom(canonicalID,id);
      *isSystemID = '\0';
    }
    else {
      ZoneMeta::getCanonicalCLDRID(id,canonicalID,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *isSystemID = '\x01';
      }
      else {
        *status = U_ZERO_ERROR;
        getCustomID(id,canonicalID,status);
      }
    }
  }
  return canonicalID;
}

Assistant:

UnicodeString&
TimeZone::getCanonicalID(const UnicodeString& id, UnicodeString& canonicalID, UBool& isSystemID,
                         UErrorCode& status)
{
    canonicalID.remove();
    isSystemID = FALSE;
    if (U_FAILURE(status)) {
        return canonicalID;
    }
    if (id.compare(UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH) == 0) {
        // special case - Etc/Unknown is a canonical ID, but not system ID
        canonicalID.fastCopyFrom(id);
        isSystemID = FALSE;
    } else {
        ZoneMeta::getCanonicalCLDRID(id, canonicalID, status);
        if (U_SUCCESS(status)) {
            isSystemID = TRUE;
        } else {
            // Not a system ID
            status = U_ZERO_ERROR;
            getCustomID(id, canonicalID, status);
        }
    }
    return canonicalID;
}